

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_0::Visitor<long>::AppendVariableDeclarationBegin(Visitor<long> *this)

{
  ostream *poVar1;
  int iVar2;
  
  poVar1 = Append(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,"int64_t",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  iVar2 = this->lastVariableNo + 1;
  this->lastVariableNo = iVar2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"var_",4);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  return;
}

Assistant:

void AppendVariableDeclarationBegin()
    {
        Append() << TypeName<TNumber>() << " " << VariableName(++lastVariableNo) << " = ";
    }